

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall enact::Parser::~Parser(Parser *this)

{
  std::__cxx11::string::~string((string *)&(this->m_current).lexeme);
  std::__cxx11::string::~string((string *)&(this->m_previous).lexeme);
  Lexer::~Lexer(&this->m_scanner);
  return;
}

Assistant:

~Parser() = default;